

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O0

void irr::executeBlit_TextureBlendColor_16_to_16(SBlitJob *job)

{
  ushort c0_00;
  int iVar1;
  long lVar2;
  u16 c1;
  u16 uVar3;
  long in_RDI;
  float fVar4;
  float fVar5;
  u16 c0;
  u32 dx;
  f18 src_x;
  u16 *src;
  u32 dy;
  u16 *dst;
  f18 src_y;
  f18 hscale;
  f18 wscale;
  u16 blend;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_24;
  undefined8 local_20;
  undefined4 local_18;
  
  c1 = video::A8R8G8B8toA1R5G5B5(*(u32 *)(in_RDI + 0x20));
  fVar4 = floorf(*(float *)(in_RDI + 0x54) * 262144.0 + 0.0);
  fVar5 = floorf(*(float *)(in_RDI + 0x58) * 262144.0 + 0.0);
  local_18 = 0;
  local_20 = *(long *)(in_RDI + 0x30);
  for (local_24 = 0; local_24 < *(uint *)(in_RDI + 0x3c); local_24 = local_24 + 1) {
    lVar2 = *(long *)(in_RDI + 0x28);
    iVar1 = *(int *)(in_RDI + 0x48);
    local_34 = 0;
    for (local_38 = 0; local_38 < *(uint *)(in_RDI + 0x38); local_38 = local_38 + 1) {
      c0_00 = *(ushort *)(lVar2 + iVar1 * (local_18 >> 0x12) + (long)(local_34 >> 0x12) * 2);
      if ((c0_00 & 0x8000) != 0) {
        uVar3 = PixelMul16_2(c0_00,c1);
        *(u16 *)(local_20 + (ulong)local_38 * 2) = uVar3;
      }
      local_34 = (int)fVar4 + local_34;
    }
    local_20 = local_20 + (ulong)*(uint *)(in_RDI + 0x4c);
    local_18 = (int)fVar5 + local_18;
  }
  return;
}

Assistant:

static void executeBlit_TextureBlendColor_16_to_16(const SBlitJob *job)
{
	const u16 blend = video::A8R8G8B8toA1R5G5B5(job->argb);

	const f18 wscale = f32_to_f18(job->x_stretch);
	const f18 hscale = f32_to_f18(job->y_stretch);

	f18 src_y = f18_zero;
	u16 *dst = (u16 *)job->dst;
	for (u32 dy = 0; dy < job->height; ++dy, src_y += hscale) {
		const u16 *src = (u16 *)((u8 *)(job->src) + job->srcPitch * f18_floor(src_y));
		f18 src_x = f18_zero;
		for (u32 dx = 0; dx < job->width; ++dx, src_x += wscale) {
			u16 c0 = src[f18_floor(src_x)];
			if (0 == (c0 & 0x8000))
				continue;

			dst[dx] = PixelMul16_2(c0, blend);
		}
		dst = (u16 *)((u8 *)(dst) + job->dstPitch);
	}
}